

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::MemberSorter::sort(MemberSorter *this)

{
  size_t count;
  size_t new_size;
  uint uVar1;
  long lVar2;
  uint32_t map_idx;
  long lVar4;
  SPIRType *pSVar5;
  Vector<Decoration> mbr_meta_cpy;
  SmallVector<unsigned_int,_8UL> mbr_idxs;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> mbr_types_cpy;
  ulong uVar3;
  
  count = (this->type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  SmallVector<unsigned_int,_8UL>::SmallVector(&mbr_idxs,count);
  lVar4 = 0;
  for (lVar2 = mbr_idxs.super_VectorView<unsigned_int>.buffer_size << 2; lVar2 != 0;
      lVar2 = lVar2 + -4) {
    mbr_idxs.super_VectorView<unsigned_int>.ptr[lVar4] = (uint)lVar4;
    lVar4 = lVar4 + 1;
  }
  ::std::
  __stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter>>
            (mbr_idxs.super_VectorView<unsigned_int>.ptr,
             mbr_idxs.super_VectorView<unsigned_int>.ptr +
             mbr_idxs.super_VectorView<unsigned_int>.buffer_size,
             (_Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter>)*this);
  uVar3 = 0xffffffffffffffff;
  do {
    uVar1 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar1;
    if (count <= uVar3) goto LAB_002ec93d;
  } while (uVar1 == mbr_idxs.super_VectorView<unsigned_int>.ptr[uVar3]);
  pSVar5 = this->type;
  new_size = (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size;
  if ((this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size < new_size)
  {
    SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&this->meta->members,new_size);
    pSVar5 = this->type;
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::SmallVector
            (&mbr_types_cpy,&pSVar5->member_types);
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::SmallVector(&mbr_meta_cpy,&this->meta->members);
  for (uVar1 = 0; uVar3 = (ulong)uVar1, uVar3 < count; uVar1 = uVar1 + 1) {
    (this->type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    [uVar3].id = mbr_types_cpy.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                 [mbr_idxs.super_VectorView<unsigned_int>.ptr[uVar3]].id;
    Meta::Decoration::operator=
              ((this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr + uVar3,
               mbr_meta_cpy.super_VectorView<spirv_cross::Meta::Decoration>.ptr +
               mbr_idxs.super_VectorView<unsigned_int>.ptr[uVar3]);
  }
  if (this->sort_aspect == Offset) {
    SmallVector<unsigned_int,_8UL>::resize(&this->type->member_type_index_redirection,count);
    pSVar5 = this->type;
    for (uVar1 = 0; uVar1 < count; uVar1 = uVar1 + 1) {
      (pSVar5->member_type_index_redirection).super_VectorView<unsigned_int>.ptr
      [mbr_idxs.super_VectorView<unsigned_int>.ptr[uVar1]] = uVar1;
    }
  }
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::~SmallVector(&mbr_meta_cpy);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::~SmallVector(&mbr_types_cpy);
LAB_002ec93d:
  SmallVector<unsigned_int,_8UL>::~SmallVector(&mbr_idxs);
  return;
}

Assistant:

void CompilerMSL::MemberSorter::sort()
{
	// Create a temporary array of consecutive member indices and sort it based on how
	// the members should be reordered, based on builtin and sorting aspect meta info.
	size_t mbr_cnt = type.member_types.size();
	SmallVector<uint32_t> mbr_idxs(mbr_cnt);
	std::iota(mbr_idxs.begin(), mbr_idxs.end(), 0); // Fill with consecutive indices
	std::stable_sort(mbr_idxs.begin(), mbr_idxs.end(), *this); // Sort member indices based on sorting aspect

	bool sort_is_identity = true;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		if (mbr_idx != mbr_idxs[mbr_idx])
		{
			sort_is_identity = false;
			break;
		}
	}

	if (sort_is_identity)
		return;

	if (meta.members.size() < type.member_types.size())
	{
		// This should never trigger in normal circumstances, but to be safe.
		meta.members.resize(type.member_types.size());
	}

	// Move type and meta member info to the order defined by the sorted member indices.
	// This is done by creating temporary copies of both member types and meta, and then
	// copying back to the original content at the sorted indices.
	auto mbr_types_cpy = type.member_types;
	auto mbr_meta_cpy = meta.members;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		type.member_types[mbr_idx] = mbr_types_cpy[mbr_idxs[mbr_idx]];
		meta.members[mbr_idx] = mbr_meta_cpy[mbr_idxs[mbr_idx]];
	}

	// If we're sorting by Offset, this might affect user code which accesses a buffer block.
	// We will need to redirect member indices from defined index to sorted index using reverse lookup.
	if (sort_aspect == SortAspect::Offset)
	{
		type.member_type_index_redirection.resize(mbr_cnt);
		for (uint32_t map_idx = 0; map_idx < mbr_cnt; map_idx++)
			type.member_type_index_redirection[mbr_idxs[map_idx]] = map_idx;
	}
}